

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeOpen(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCursor)

{
  int iVar1;
  sqlite3_vtab_cursor *__s;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    __s = (sqlite3_vtab_cursor *)sqlite3Malloc(0x128);
  }
  else {
    __s = (sqlite3_vtab_cursor *)0x0;
  }
  if (__s == (sqlite3_vtab_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = 0;
    memset(__s,0,0x128);
    __s->pVtab = pVTab;
    pVTab[3].nRef = pVTab[3].nRef + 1;
  }
  *ppCursor = __s;
  return iVar1;
}

Assistant:

static int rtreeOpen(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCursor){
  int rc = SQLITE_NOMEM;
  Rtree *pRtree = (Rtree *)pVTab;
  RtreeCursor *pCsr;

  pCsr = (RtreeCursor *)sqlite3_malloc64(sizeof(RtreeCursor));
  if( pCsr ){
    memset(pCsr, 0, sizeof(RtreeCursor));
    pCsr->base.pVtab = pVTab;
    rc = SQLITE_OK;
    pRtree->nCursor++;
  }
  *ppCursor = (sqlite3_vtab_cursor *)pCsr;

  return rc;
}